

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AStateProvider_A_CheckForReload
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AWeapon *this;
  PClass *pPVar2;
  PClass *pPVar3;
  PClassActor *cls;
  FState *val;
  int iVar4;
  char *pcVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  bool bVar9;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
LAB_003d93d8:
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      puVar8 = (undefined8 *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (puVar8 == (undefined8 *)0x0) goto LAB_003d9192;
        pPVar3 = (PClass *)puVar8[1];
        if (pPVar3 == (PClass *)0x0) {
          pPVar3 = (PClass *)(**(code **)*puVar8)(puVar8);
          puVar8[1] = pPVar3;
        }
        bVar9 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar2 && bVar9) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar9 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar2) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d93e8;
        }
      }
      else {
        if (puVar8 != (undefined8 *)0x0) goto LAB_003d93cf;
LAB_003d9192:
        puVar8 = (undefined8 *)0x0;
      }
      pPVar2 = AStateProvider::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_003d93d8;
      if (param[1].field_0.field_3.Type == '\x03') {
        puVar7 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar7 == (undefined8 *)0x0) {
LAB_003d9234:
            puVar7 = (undefined8 *)0x0;
          }
          else {
            pPVar3 = (PClass *)puVar7[1];
            if (pPVar3 == (PClass *)0x0) {
              pPVar3 = (PClass *)(**(code **)*puVar7)(puVar7);
              puVar7[1] = pPVar3;
            }
            bVar9 = pPVar3 != (PClass *)0x0;
            if (pPVar3 != pPVar2 && bVar9) {
              do {
                pPVar3 = pPVar3->ParentClass;
                bVar9 = pPVar3 != (PClass *)0x0;
                if (pPVar3 == pPVar2) break;
              } while (pPVar3 != (PClass *)0x0);
            }
            if (!bVar9) {
              pcVar5 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
              goto LAB_003d93e8;
            }
          }
          if (2 < numparam) {
            if (param[2].field_0.field_3.Type == '\x03') {
              if ((puVar8[0x46] == 0) || (*(long *)(puVar8[0x46] + 0xd0) == 0)) {
                if (numret < 1) {
                  iVar6 = 0;
                }
                else {
                  if (ret == (VMReturn *)0x0) {
                    __assert_fail("ret != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                  ,0x1172,
                                  "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  VMReturn::SetPointer(ret,(void *)0x0,0);
                  iVar6 = 1;
                }
                return iVar6;
              }
              if (numparam == 3) {
                pcVar5 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\0') {
                  if ((uint)numparam < 5) {
                    pcVar5 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\0') {
                      iVar6 = param[3].field_0.i;
                      iVar1 = param[4].field_0.i;
                      cls = (PClassActor *)puVar7[1];
                      if (cls == (PClassActor *)0x0) {
                        cls = (PClassActor *)(**(code **)*puVar7)(puVar7);
                        puVar7[1] = cls;
                      }
                      val = FStateLabelStorage::GetState(&StateLabels,iVar1,cls,false);
                      if (numparam == 5) {
                        param = defaultparam->Array;
                        if (param[5].field_0.field_3.Type != '\0') {
                          pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d9476:
                          __assert_fail(pcVar5,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                        ,0x1176,
                                        "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                      }
                      else if (param[5].field_0.field_3.Type != '\0') {
                        pcVar5 = "(param[paramnum]).Type == REGT_INT";
                        goto LAB_003d9476;
                      }
                      iVar1 = param[5].field_0.i;
                      if (0 < numret) {
                        VMReturn::SetPointer(ret,(void *)0x0,0);
                        numret = 1;
                      }
                      this = *(AWeapon **)(puVar8[0x46] + 0xd0);
                      if (((iVar1 == 0) || (iVar4 = 1, this->ReloadCounter != 0)) &&
                         (iVar4 = (this->ReloadCounter + 1) % iVar6, iVar4 == 0)) {
                        iVar4 = 0;
                        AWeapon::CheckAmmo(this,0,false,false,-1);
                      }
                      else if (numret != 0) {
                        VMReturn::SetPointer(ret,val,0);
                      }
                      if (iVar1 != 0) {
                        return numret;
                      }
                      this->ReloadCounter = iVar4;
                      return numret;
                    }
                    pcVar5 = "param[paramnum].Type == REGT_INT";
                  }
                  __assert_fail(pcVar5,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x1175,
                                "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar5 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar5,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1174,
                            "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar5 = "param[paramnum].Type == REGT_POINTER";
            goto LAB_003d93e8;
          }
          goto LAB_003d93d8;
        }
        if (puVar7 == (undefined8 *)0x0) goto LAB_003d9234;
      }
    }
LAB_003d93cf:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d93e8:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x116e,
                "int AF_AStateProvider_A_CheckForReload(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_CheckForReload)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);

	if ( self->player == NULL || self->player->ReadyWeapon == NULL )
	{
		ACTION_RETURN_STATE(NULL);
	}
	PARAM_INT		(count);
	PARAM_STATE_ACTION	(jump);
	PARAM_BOOL_DEF	(dontincrement);

	if (numret > 0)
	{
		ret->SetPointer(NULL, ATAG_STATE);
		numret = 1;
	}

	AWeapon *weapon = self->player->ReadyWeapon;

	int ReloadCounter = weapon->ReloadCounter;
	if (!dontincrement || ReloadCounter != 0)
		ReloadCounter = (weapon->ReloadCounter+1) % count;
	else // 0 % 1 = 1?  So how do we check if the weapon was never fired?  We should only do this when we're not incrementing the counter though.
		ReloadCounter = 1;

	// If we have not made our last shot...
	if (ReloadCounter != 0)
	{
		// Go back to the refire frames, instead of continuing on to the reload frames.
		if (numret != 0)
		{
			ret->SetPointer(jump, ATAG_STATE);
		}
	}
	else
	{
		// We need to reload. However, don't reload if we're out of ammo.
		weapon->CheckAmmo(false, false);
	}
	if (!dontincrement)
	{
		weapon->ReloadCounter = ReloadCounter;
	}
	return numret;
}